

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBoxAlgo.cpp
# Opt level: O1

Box3f * anon_unknown.dwarf_378dd::transformSimple(Box3f *__return_storage_ptr__,Box3f *b,M44f *M)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  Box3f *b1;
  uint uVar13;
  long lVar14;
  Box3f *pBVar15;
  uint uVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  V3f p;
  
  b1 = __return_storage_ptr__;
  fVar18 = 3.4028235e+38;
  fVar19 = 3.4028235e+38;
  fVar20 = 3.4028235e+38;
  fVar21 = -3.4028235e+38;
  (__return_storage_ptr__->min).x = 3.4028235e+38;
  (__return_storage_ptr__->min).y = 3.4028235e+38;
  (__return_storage_ptr__->min).z = 3.4028235e+38;
  (__return_storage_ptr__->max).x = -3.4028235e+38;
  uVar22 = 0xff7fffff;
  uVar23 = 0xff7fffff;
  uVar24 = 0;
  uVar25 = 0;
  (__return_storage_ptr__->max).y = -3.4028235e+38;
  (__return_storage_ptr__->max).z = -3.4028235e+38;
  fVar9 = M->x[0][0];
  fVar10 = M->x[1][0];
  fVar11 = M->x[2][0];
  fVar12 = M->x[3][0];
  uVar5 = *(undefined8 *)(M->x[0] + 1);
  uVar6 = *(undefined8 *)(M->x[1] + 1);
  uVar7 = *(undefined8 *)(M->x[2] + 1);
  uVar8 = *(undefined8 *)(M->x[3] + 1);
  fVar1 = M->x[2][3];
  fVar2 = M->x[0][3];
  fVar3 = M->x[1][3];
  fVar4 = M->x[3][3];
  uVar13 = 0;
  do {
    lVar14 = 0;
    do {
      pBVar15 = (Box3f *)&b->max;
      if ((uVar13 >> ((uint)lVar14 & 0x1f) & 1) == 0) {
        pBVar15 = b;
      }
      (&p.x)[lVar14] = (&(pBVar15->min).x)[lVar14];
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    fVar30 = p.z * fVar1 + p.x * fVar2 + p.y * fVar3 + fVar4;
    fVar29 = (p.z * fVar11 + p.x * fVar9 + p.y * fVar10 + fVar12) / fVar30;
    auVar26._0_4_ = p.z * (float)uVar7 + p.x * (float)uVar5 + p.y * (float)uVar6 + (float)uVar8;
    auVar26._4_4_ =
         p.z * (float)((ulong)uVar7 >> 0x20) +
         p.x * (float)((ulong)uVar5 >> 0x20) + p.y * (float)((ulong)uVar6 >> 0x20) +
         (float)((ulong)uVar8 >> 0x20);
    auVar26._8_4_ = p.z * 0.0 + p.x * 0.0 + p.y * 0.0 + 0.0;
    auVar26._12_4_ = p.z * 0.0 + p.x * 0.0 + p.y * 0.0 + 0.0;
    auVar27._4_4_ = fVar30;
    auVar27._0_4_ = fVar30;
    auVar27._8_4_ = fVar30;
    auVar27._12_4_ = fVar30;
    auVar27 = divps(auVar26,auVar27);
    uVar16 = -(uint)(auVar27._0_4_ < fVar19);
    uVar17 = -(uint)(auVar27._4_4_ < fVar20);
    fVar18 = (float)(~-(uint)(fVar29 < fVar18) & (uint)fVar18 |
                    (uint)fVar29 & -(uint)(fVar29 < fVar18));
    fVar19 = (float)(~uVar16 & (uint)fVar19 | (uint)auVar27._0_4_ & uVar16);
    fVar20 = (float)(~uVar17 & (uint)fVar20 | (uint)auVar27._4_4_ & uVar17);
    fVar21 = (float)(~-(uint)(fVar21 < fVar29) & (uint)fVar21 |
                    (uint)fVar29 & -(uint)(fVar21 < fVar29));
    auVar28._4_4_ = uVar23;
    auVar28._0_4_ = uVar22;
    auVar28._8_4_ = uVar24;
    auVar28._12_4_ = uVar25;
    auVar28 = maxps(auVar27,auVar28);
    uVar13 = uVar13 + 1;
    uVar22 = auVar28._0_4_;
    uVar23 = auVar28._4_4_;
    uVar24 = auVar28._8_4_;
    uVar25 = auVar28._12_4_;
  } while (uVar13 != 8);
  (__return_storage_ptr__->min).x = fVar18;
  (__return_storage_ptr__->min).y = fVar19;
  (__return_storage_ptr__->min).z = fVar20;
  (__return_storage_ptr__->max).x = fVar21;
  (__return_storage_ptr__->max).y = (float)(int)auVar28._0_8_;
  (__return_storage_ptr__->max).z = (float)(int)((ulong)auVar28._0_8_ >> 0x20);
  return b1;
}

Assistant:

Box3f
transformSimple (const Box3f &b, const M44f &M)
{
    Box3f b1;

    for (int i = 0; i < 8; ++i)
    {
	V3f p;

	for (int j = 0; j < 3; ++j)
	    p[j] = ((i >> j) & 1)? b.max[j]: b.min[j];

	b1.extendBy (p * M);
    }

    return b1;
}